

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O2

int process_events_stone(CManager_conflict cm,int s,action_class c)

{
  uint *remote_path_id;
  int *piVar1;
  action_value aVar2;
  int iVar3;
  event_path_data p_Var4;
  int *piVar5;
  _proto_action *p_Var6;
  queue_item *pqVar7;
  FMFormat p_Var8;
  EVSimpleHandlerFunc p_Var9;
  EVImmediateHandlerFunc p_Var10;
  _ev_handler_activation_rec *p_Var11;
  _ev_handler_activation_rec *p_Var12;
  bool bVar13;
  uint uVar14;
  int iVar15;
  __pid_t _Var16;
  stone_type stone;
  stone_type p_Var17;
  event_item *peVar18;
  stone_type p_Var19;
  void *pvVar20;
  response_cache_element *prVar21;
  event_item *peVar22;
  CManager_conflict p_Var23;
  queue_item *pqVar24;
  ev_handler_activation_ptr p_Var25;
  CMConnection p_Var26;
  attr_list p_Var27;
  pthread_t pVar28;
  int iVar29;
  FILE *pFVar30;
  int iVar31;
  undefined1 *puVar32;
  CManager_conflict p_Var33;
  event_path_data p_Var34;
  queue_item *pqVar35;
  char *pcVar36;
  char *in_R8;
  long lVar37;
  long lVar38;
  _event_path_data *p_Var39;
  response_cache_element *act;
  size_t sStackY_100;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 uVar40;
  timespec ts_2;
  size_t event_length;
  timespec ts;
  queue_item *local_40;
  
  if (s == -1) {
    return 0;
  }
  p_Var4 = cm->evp;
  piVar5 = (int *)p_Var4->as;
  if (*piVar5 == s) {
    *piVar5 = -1;
  }
  stone = stone_struct(p_Var4,s);
  if (stone == (stone_type)0x0) {
    return 0;
  }
  if (stone->queue_size == 0) {
    return 0;
  }
  pFVar30 = (FILE *)cm->CMTrace_file;
  if (pFVar30 == (FILE *)0x0) {
    iVar29 = CMtrace_init(cm,EVerbose);
    if (iVar29 != 0) {
      pFVar30 = (FILE *)cm->CMTrace_file;
      goto LAB_00132097;
    }
  }
  else if (CMtrace_val[10] != 0) {
LAB_00132097:
    fwrite("Considering events on ",0x16,1,pFVar30);
    fprint_stone_identifier(cm->CMTrace_file,p_Var4,s);
    fputc(10,(FILE *)cm->CMTrace_file);
  }
  if (stone->local_id == -1) {
    return 0;
  }
  if (stone->is_draining == 2) {
    return 0;
  }
  if (stone->is_frozen == 1) {
    return 0;
  }
  iVar29 = 0;
  if ((c == Immediate_and_Multi) && (stone->pending_output != 0)) {
    p_Var34 = cm->evp;
    pvVar20 = p_Var34->as;
    p_Var17 = stone_struct(p_Var34,s);
    lVar38 = 0;
    lVar37 = 0x30;
    iVar29 = 0;
    iVar31 = 0;
    while ((lVar38 < p_Var17->proto_action_count && (iVar31 < p_Var17->pending_output))) {
      p_Var6 = p_Var17->proto_actions;
      if ((*(int *)((long)p_Var6 + lVar37 + -0x30) == 10) &&
         ((*(int *)((long)p_Var6 + lVar37 + -0x10) != 0 &&
          (*(int *)((long)p_Var6 + lVar37 + -0x14) == 0)))) {
        peVar18 = (event_item *)
                  (**(code **)(*(long *)((long)&p_Var6->matching_reference_formats + lVar37) + 0x18)
                  )(cm,(long)&p_Var6->action_type + lVar37);
        if (peVar18->ref_count < 1) {
          __assert_fail("item->ref_count > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                        ,0xac3,"int process_stone_pending_output(CManager, EVstone)");
        }
        p_Var19 = stone_struct(p_Var34,*(int *)((long)p_Var6 + lVar37 + -0x18));
        if (p_Var19->is_stalled != 0) {
          __assert_fail("!stone_struct(evp, act->o.store.target_stone_id)->is_stalled",
                        "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                        ,0xac4,"int process_stone_pending_output(CManager, EVstone)");
        }
        internal_path_submit(cm,*(int *)((long)p_Var6 + lVar37 + -0x18),peVar18);
        piVar1 = (int *)((long)p_Var6 + lVar37 + -8);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          *(undefined8 *)((long)p_Var6 + lVar37 + -0x14) = 0;
          piVar1 = (int *)((long)pvVar20 + 4);
          *piVar1 = *piVar1 + -1;
          p_Var17->pending_output = p_Var17->pending_output + -1;
        }
        else {
          iVar31 = iVar31 + 1;
          iVar29 = iVar29 + 1;
        }
      }
      lVar38 = lVar38 + 1;
      lVar37 = lVar37 + 0x60;
    }
  }
  iVar31 = is_bridge_stone(cm,s);
  if ((c != Bridge) && (iVar31 != 0)) {
    return 0;
  }
  pFVar30 = (FILE *)cm->CMTrace_file;
  if (pFVar30 == (FILE *)0x0) {
    iVar31 = CMtrace_init(cm,EVerbose);
    if (iVar31 != 0) {
      pFVar30 = (FILE *)cm->CMTrace_file;
      goto LAB_00132270;
    }
  }
  else if (CMtrace_val[10] != 0) {
LAB_00132270:
    fwrite("Process events ",0xf,1,pFVar30);
    fprint_stone_identifier(cm->CMTrace_file,p_Var4,s);
    fputc(10,(FILE *)cm->CMTrace_file);
  }
  pqVar7 = stone->queue->queue_head;
  iVar31 = is_bridge_stone(cm,s);
  uVar40 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  if ((c != Bridge) || (iVar31 == 0)) {
    bVar13 = false;
LAB_00132332:
    do {
      do {
        do {
          pqVar24 = pqVar7;
          if (((pqVar24 == (queue_item *)0x0) || (stone->is_draining != 0)) ||
             (stone->is_frozen != 0)) goto LAB_00133240;
          pqVar35 = pqVar24->next;
          pqVar7 = pqVar35;
        } while (pqVar24->handled != 0);
        peVar18 = pqVar24->item;
        uVar14 = determine_action(cm,stone,c,peVar18,(int)in_R8);
        if (stone->response_cache_count <= (int)uVar14) {
          __assert_fail("resp_id < stone->response_cache_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                        ,0x6d0,"int process_events_stone(CManager, int, action_class)");
        }
        prVar21 = stone->response_cache;
        if ((c == Immediate_and_Multi) && (prVar21[(int)uVar14].action_type == Action_NoAction)) {
          if (peVar18->reference_format == (FMFormat)0x0) {
            pvVar20 = (void *)0x0;
          }
          else {
            pvVar20 = (void *)global_name_of_FMFormat();
          }
          printf("No action found for event %p submitted to \n",peVar18);
          fprint_stone_identifier(_stdout,p_Var4,s);
          putchar(10);
          p_Var17 = stone_struct(p_Var4,s);
          dump_stone(p_Var17);
          pcVar36 = "    Unhandled incoming event format was NULL";
          if (pvVar20 == (void *)0x0) {
LAB_00132445:
            puts(pcVar36);
          }
          else {
            printf("    Unhandled incoming event format was \"%s\"\n",pvVar20);
            if (process_events_stone_first == '\0') {
              process_events_stone_first = '\x01';
              pcVar36 = 
              "\n\t** use \"format_info <format_name>\" to get full format information ** \n";
              goto LAB_00132445;
            }
          }
          free(pvVar20);
          p_Var23 = cm;
          peVar18 = dequeue_item(cm,stone,pqVar24);
          return_event((event_path_data)p_Var23,peVar18);
          prVar21 = stone->response_cache;
        }
        act = prVar21 + (int)uVar14;
        if (prVar21[(int)uVar14].action_type == Action_Decode) {
          if (peVar18->event_encoded == 0) {
            iVar31 = CMtrace_val[10];
            if (cm->CMTrace_file == (FILE *)0x0) {
              iVar31 = CMtrace_init(cm,EVerbose);
            }
            if (iVar31 != 0) {
              if (CMtrace_PID != 0) {
                pFVar30 = (FILE *)cm->CMTrace_file;
                _Var16 = getpid();
                pVar28 = pthread_self();
                fprintf(pFVar30,"P%lxT%lx - ",(long)_Var16,pVar28);
              }
              if (CMtrace_timing != 0) {
                clock_gettime(1,(timespec *)&ts);
                fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
              }
              fprintf((FILE *)cm->CMTrace_file,
                      "Encoding event prior to decode for conversion, action id %d\n",(ulong)uVar14)
              ;
            }
            fflush((FILE *)cm->CMTrace_file);
            p_Var23 = cm;
            peVar22 = reassign_memory_event(cm,peVar18,0);
            return_event((event_path_data)p_Var23,peVar22);
            peVar18->ref_count = peVar18->ref_count + 1;
          }
          iVar31 = CMtrace_val[10];
          if (cm->CMTrace_file == (FILE *)0x0) {
            iVar31 = CMtrace_init(cm,EVerbose);
          }
          if (iVar31 != 0) {
            if (CMtrace_PID != 0) {
              pFVar30 = (FILE *)cm->CMTrace_file;
              _Var16 = getpid();
              pVar28 = pthread_self();
              fprintf(pFVar30,"P%lxT%lx - ",(long)_Var16,pVar28);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,(timespec *)&ts);
              fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
            }
            fprintf((FILE *)cm->CMTrace_file,"Decoding event, action id %d\n",(ulong)uVar14);
          }
          fflush((FILE *)cm->CMTrace_file);
          peVar22 = decode_action(cm,peVar18,act);
          if (peVar22 == (event_item *)0x0) {
            return iVar29;
          }
          pqVar24->item = peVar22;
          uVar14 = determine_action(cm,stone,c,peVar22,(int)in_R8);
          act = stone->response_cache + (int)uVar14;
        }
        uVar40 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
        pFVar30 = (FILE *)cm->CMTrace_file;
        if (pFVar30 == (FILE *)0x0) {
          iVar31 = CMtrace_init(cm,EVerbose);
          uVar40 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
          if (iVar31 != 0) {
            pFVar30 = (FILE *)cm->CMTrace_file;
            goto LAB_001326ce;
          }
        }
        else if (CMtrace_val[10] != 0) {
LAB_001326ce:
          fprintf(pFVar30,"next action event %p on ",peVar18);
          fprint_stone_identifier(cm->CMTrace_file,p_Var4,s);
          pFVar30 = (FILE *)cm->CMTrace_file;
          pcVar36 = action_str[act->action_type];
          p_Var8 = act->reference_format;
          in_R8 = "<none>";
          if (p_Var8 != (FMFormat)0x0) {
            in_R8 = (char *)global_name_of_FMFormat(p_Var8);
          }
          in_stack_ffffffffffffff08 = CONCAT44(uVar40,act->requires_decoded);
          fprintf(pFVar30,
                  " action type is %s, reference_format is %p (%s), stage is %d, requires_decoded is %d\n"
                  ,pcVar36,p_Var8,in_R8,(ulong)act->stage,in_stack_ffffffffffffff08);
          fdump_action(cm->CMTrace_file,stone,act,act->proto_action_id,in_R8);
        }
        prVar21 = stone->response_cache;
        backpressure_check(cm,s);
      } while (((prVar21[(int)uVar14].stage != c) &&
               (c != Immediate_and_Multi || prVar21[(int)uVar14].stage != Immediate)) ||
              (aVar2 = prVar21[(int)uVar14].action_type, Action_Congestion < aVar2));
      if ((0x63cU >> (aVar2 & 0x1f) & 1) == 0) goto LAB_00132c15;
      p_Var23 = (CManager_conflict)dequeue_item(cm,stone,pqVar24);
      switch(prVar21[(int)uVar14].action_type) {
      case Action_Thread_Bridge:
        p_Var6 = stone->proto_actions;
        iVar31 = prVar21[(int)uVar14].proto_action_id;
        pqVar7 = pqVar24;
        if (p_Var6[iVar31].o.term.target_stone_id == 0) {
          thread_bridge_transfer
                    (cm,(event_item *)p_Var23,p_Var6[iVar31].o.thr_bri.target_cm,
                     p_Var6[iVar31].o.thr_bri.target_stone_id);
          pqVar7 = pqVar35;
        }
        break;
      case Action_Terminal:
      case Action_Filter:
        iVar31 = prVar21[(int)uVar14].proto_action_id;
        p_Var6 = stone->proto_actions;
        p_Var9 = p_Var6[iVar31].o.term.handler;
        p_Var27 = (attr_list)p_Var6[iVar31].o.term.client_data;
        iVar15 = CMtrace_val[10];
        if (cm->CMTrace_file == (FILE *)0x0) {
          iVar15 = CMtrace_init(cm,EVerbose);
        }
        if (iVar15 != 0) {
          if (CMtrace_PID != 0) {
            pFVar30 = (FILE *)cm->CMTrace_file;
            _Var16 = getpid();
            pVar28 = pthread_self();
            fprintf(pFVar30,"P%lxT%lx - ",(long)_Var16,pVar28);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts_2);
            fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",
                    CONCAT44(ts_2.tv_sec._4_4_,(int)ts_2.tv_sec),ts_2.tv_nsec);
          }
          fwrite("Executing terminal/filter event\n",0x20,1,(FILE *)cm->CMTrace_file);
        }
        peVar22 = (event_item *)(p_Var6 + iVar31);
        fflush((FILE *)cm->CMTrace_file);
        peVar18 = peVar22;
        update_event_length_sum(cm,(proto_action *)peVar22,(event_item *)p_Var23);
        pqVar24 = (queue_item *)INT_CMmalloc(0x18);
        pqVar24->item = (event_item *)p_Var23;
        p_Var39 = cm->evp;
        pqVar24->next = p_Var39->current_event_list;
        p_Var39->current_event_list = pqVar24;
        stone->is_processing = 1;
        if ((*(encode_state *)&peVar22->attrs == Requires_Contig_Encoded) &&
           (*(int *)((long)&p_Var23->transports + 4) == 0)) {
          encode_event(p_Var23,peVar18);
          p_Var39 = cm->evp;
        }
        pVar28 = pthread_self();
        if (p_Var39->activation_stack != (ev_handler_activation_ptr)0x0) {
          p_Var39->activation_stack->prev = (_ev_handler_activation_rec *)&ts;
        }
        ts.tv_sec = 0;
        p_Var39->activation_stack = (_ev_handler_activation_rec *)&ts;
        ts.tv_nsec = pVar28;
        IntCManager_unlock(cm,
                           "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                           ,0x725);
        if (*(int *)((long)&p_Var23->transports + 4) == 0) {
          iVar31 = (*p_Var9)(cm,p_Var23->control_list,p_Var27,
                             *(attr_list *)&p_Var23->reg_user_format_count);
        }
        else {
          in_R8 = *(char **)&p_Var23->reg_user_format_count;
          iVar31 = (*(((anon_union_48_6_c1ce387a_for_o *)&peVar22->event_len)->term).handler)
                             (cm,p_Var23->control_module_choice,*(void **)&p_Var23->CManager_ID,
                              p_Var27);
        }
        IntCManager_lock(cm,
                         "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                         ,0x72e);
        stone = stone_struct(cm->evp,s);
        p_Var25 = cm->evp->activation_stack;
        if (p_Var25 == (ev_handler_activation_ptr)0x0) {
          pcVar36 = "Activation stack inconsistency!  No records!";
LAB_00132d3e:
          puts(pcVar36);
        }
        else if (p_Var25->thread_id == pVar28) {
          p_Var11 = p_Var25->next;
          cm->evp->activation_stack = p_Var11;
          if (p_Var11 != (_ev_handler_activation_rec *)0x0) {
            p_Var11->prev = (_ev_handler_activation_rec *)0x0;
          }
        }
        else {
          do {
            p_Var25 = p_Var25->next;
            if (p_Var25 == (_ev_handler_activation_rec *)0x0) {
              pcVar36 = "Activation stack inconsistency!  Record with thread ID now found!";
              goto LAB_00132d3e;
            }
          } while (p_Var25->thread_id != pVar28);
          p_Var11 = p_Var25->prev;
          p_Var12 = p_Var25->next;
          p_Var11->next = p_Var12;
          if (p_Var12 != (_ev_handler_activation_rec *)0x0) {
            p_Var12->prev = p_Var11;
          }
        }
        stone->is_processing = 0;
        pqVar24 = cm->evp->current_event_list;
        if ((CManager_conflict)pqVar24->item == p_Var23) {
          cm->evp->current_event_list = pqVar24->next;
          free(pqVar24);
        }
        else {
          do {
            pqVar35 = pqVar24;
            pqVar24 = pqVar35->next;
            if ((CManager_conflict)pqVar35->item == p_Var23) {
              local_40->next = pqVar24;
              free(pqVar35);
              goto LAB_00132db4;
            }
            local_40 = pqVar35;
          } while (pqVar24 != (queue_item *)0x0);
          puts("Failed to dequeue item from executing events list!");
        }
LAB_00132db4:
        if (prVar21[(int)uVar14].action_type == Action_Filter) {
          if (iVar31 == 0) {
            iVar31 = CMtrace_val[10];
            if (cm->CMTrace_file == (FILE *)0x0) {
              iVar31 = CMtrace_init(cm,EVerbose);
            }
            if (iVar31 != 0) {
              if (CMtrace_PID != 0) {
                pFVar30 = (FILE *)cm->CMTrace_file;
                _Var16 = getpid();
                fprintf(pFVar30,"P%lxT%lx - ",(long)_Var16,pVar28);
              }
              if (CMtrace_timing != 0) {
                clock_gettime(1,(timespec *)&ts_2);
                fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",
                        CONCAT44(ts_2.tv_sec._4_4_,(int)ts_2.tv_sec),ts_2.tv_nsec);
              }
              pFVar30 = (FILE *)cm->CMTrace_file;
              pcVar36 = "Filter discarded event\n";
              sStackY_100 = 0x17;
              goto LAB_00133113;
            }
            goto LAB_0013311c;
          }
          iVar31 = CMtrace_val[10];
          if (cm->CMTrace_file == (FILE *)0x0) {
            iVar31 = CMtrace_init(cm,EVerbose);
          }
          if (iVar31 != 0) {
            if (CMtrace_PID != 0) {
              pFVar30 = (FILE *)cm->CMTrace_file;
              _Var16 = getpid();
              fprintf(pFVar30,"P%lxT%lx - ",(long)_Var16,pVar28);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,(timespec *)&ts_2);
              fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",
                      CONCAT44(ts_2.tv_sec._4_4_,(int)ts_2.tv_sec),ts_2.tv_nsec);
            }
            fprintf((FILE *)cm->CMTrace_file,"Filter passed event to stone %x, submitting\n",
                    (ulong)*(uint *)&peVar22->encoded_eventv);
          }
          fflush((FILE *)cm->CMTrace_file);
          p_Var33 = cm;
          internal_path_submit(cm,*(int *)&peVar22->encoded_eventv,(event_item *)p_Var23);
          iVar29 = iVar29 + 1;
        }
        else {
          iVar31 = CMtrace_val[10];
          if (cm->CMTrace_file == (FILE *)0x0) {
            iVar31 = CMtrace_init(cm,EVerbose);
          }
          if (iVar31 != 0) {
            if (CMtrace_PID != 0) {
              pFVar30 = (FILE *)cm->CMTrace_file;
              _Var16 = getpid();
              fprintf(pFVar30,"P%lxT%lx - ",(long)_Var16,pVar28);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,(timespec *)&ts_2);
              fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",
                      CONCAT44(ts_2.tv_sec._4_4_,(int)ts_2.tv_sec),ts_2.tv_nsec);
            }
            pFVar30 = (FILE *)cm->CMTrace_file;
            pcVar36 = "Finish terminal event\n";
            sStackY_100 = 0x16;
LAB_00133113:
            fwrite(pcVar36,sStackY_100,1,pFVar30);
          }
LAB_0013311c:
          p_Var33 = (CManager_conflict)cm->CMTrace_file;
          fflush((FILE *)p_Var33);
        }
        return_event((event_path_data)p_Var33,(event_item *)p_Var23);
        bVar13 = true;
        break;
      case Action_Immediate:
        iVar31 = piVar5[1];
        p_Var10 = prVar21[(int)uVar14].o.imm.handler;
        p_Var8 = prVar21[(int)uVar14].o.decode.target_reference_format;
        in_R8 = (char *)(ulong)(uint)stone->output_count;
        stone->is_processing = 1;
        (*p_Var10)(cm,(_event_item *)p_Var23,p_Var8,*(attr_list *)&p_Var23->reg_user_format_count,
                   stone->output_count,stone->output_stone_ids);
        p_Var34 = cm->evp;
        stone = stone_struct(p_Var34,s);
        stone->is_processing = 0;
        return_event(p_Var34,(event_item *)p_Var23);
        iVar29 = iVar29 + (uint)(iVar31 < piVar5[1]);
        bVar13 = true;
        break;
      default:
        __assert_fail("FALSE",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                      ,0x796,"int process_events_stone(CManager, int, action_class)");
      case Action_Split:
        p_Var33 = cm;
        update_event_length_sum
                  (cm,stone->proto_actions + prVar21[(int)uVar14].proto_action_id,
                   (event_item *)p_Var23);
        for (lVar37 = 0; lVar37 < stone->output_count; lVar37 = lVar37 + 1) {
          if (stone->output_stone_ids[lVar37] != -1) {
            p_Var33 = cm;
            internal_path_submit(cm,stone->output_stone_ids[lVar37],(event_item *)p_Var23);
            iVar29 = iVar29 + 1;
          }
        }
        return_event((event_path_data)p_Var33,(event_item *)p_Var23);
        break;
      case Action_Store:
        p_Var6 = stone->proto_actions;
        iVar31 = prVar21[(int)uVar14].proto_action_id;
        puVar32 = (undefined1 *)((long)&p_Var6[iVar31].o + 0x18);
        (**(code **)(p_Var6[iVar31].o.bri.remote_contact + 0x10))(cm,puVar32,p_Var23);
        iVar15 = CMtrace_val[10];
        if (cm->CMTrace_file == (FILE *)0x0) {
          iVar15 = CMtrace_init(cm,EVerbose);
        }
        if (iVar15 != 0) {
          if (CMtrace_PID != 0) {
            pFVar30 = (FILE *)cm->CMTrace_file;
            _Var16 = getpid();
            pVar28 = pthread_self();
            fprintf(pFVar30,"P%lxT%lx - ",(long)_Var16,pVar28);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts_2);
            fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",
                    CONCAT44(ts_2.tv_sec._4_4_,(int)ts_2.tv_sec),ts_2.tv_nsec);
          }
          fwrite("Enqueued item to store\n",0x17,1,(FILE *)cm->CMTrace_file);
        }
        fflush((FILE *)cm->CMTrace_file);
        iVar15 = p_Var6[iVar31].o.store.max_stored;
        iVar3 = p_Var6[iVar31].o.term.target_stone_id;
        p_Var6[iVar31].o.term.target_stone_id = iVar3 + 1;
        if (iVar15 != -1 && iVar15 <= iVar3) {
          iVar15 = CMtrace_val[10];
          if (cm->CMTrace_file == (FILE *)0x0) {
            iVar15 = CMtrace_init(cm,EVerbose);
          }
          if (iVar15 != 0) {
            if (CMtrace_PID != 0) {
              pFVar30 = (FILE *)cm->CMTrace_file;
              _Var16 = getpid();
              pVar28 = pthread_self();
              fprintf(pFVar30,"P%lxT%lx - ",(long)_Var16,pVar28);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,(timespec *)&ts_2);
              fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",
                      CONCAT44(ts_2.tv_sec._4_4_,(int)ts_2.tv_sec),ts_2.tv_nsec);
            }
            fwrite("Dequeuing item because of limit\n",0x20,1,(FILE *)cm->CMTrace_file);
          }
          fflush((FILE *)cm->CMTrace_file);
          peVar18 = (event_item *)
                    (**(code **)(p_Var6[iVar31].o.bri.remote_contact + 0x18))(cm,puVar32);
          if (peVar18->ref_count < 1) {
            __assert_fail("last_event->ref_count > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                          ,0x785,"int process_events_stone(CManager, int, action_class)");
          }
          piVar1 = &p_Var6[iVar31].o.term.target_stone_id;
          *piVar1 = *piVar1 + -1;
          p_Var23 = cm;
          internal_path_submit(cm,p_Var6[iVar31].o.thr_bri.target_stone_id,peVar18);
          return_event((event_path_data)p_Var23,peVar18);
          iVar29 = iVar29 + 1;
        }
      }
    } while( true );
  }
  stone->is_processing = 1;
  p_Var4 = cm->evp;
  p_Var17 = stone_struct(p_Var4,s);
  iVar29 = CMtrace_val[10];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar29 = CMtrace_init(cm,EVerbose);
  }
  if (iVar29 != 0) {
    if (CMtrace_PID != 0) {
      pFVar30 = (FILE *)cm->CMTrace_file;
      _Var16 = getpid();
      pVar28 = pthread_self();
      fprintf(pFVar30,"P%lxT%lx - ",(long)_Var16,pVar28);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,
            "Process output action on stone %x, frozen %d draining %d outputting %d, in_get_conn %d\n"
            ,(ulong)(uint)s,(ulong)(uint)p_Var17->is_frozen,(ulong)(uint)p_Var17->is_draining,
            (ulong)(uint)p_Var17->is_outputting,CONCAT44(uVar40,p_Var4->in_get_conn));
  }
  fflush((FILE *)cm->CMTrace_file);
  if (((p_Var17->is_frozen == 0) && (p_Var17->is_draining != 2)) && (p_Var17->is_outputting == 0)) {
    if (p_Var4->in_get_conn == 0) {
      p_Var17->is_outputting = 1;
      lVar37 = 0;
      uVar14 = p_Var17->proto_action_count;
      if (p_Var17->proto_action_count < 1) {
        uVar14 = 0;
      }
      lVar38 = 0;
      for (; (ulong)uVar14 * 0x60 - lVar37 != 0; lVar37 = lVar37 + 0x60) {
        if (*(int *)((long)&p_Var17->proto_actions->action_type + lVar37) == 1) {
          lVar38 = (long)&p_Var17->proto_actions->action_type + lVar37;
        }
      }
      if (*(int *)(lVar38 + 0x30) == 0) {
        if (*(long *)(lVar38 + 0x18) == 0) {
          p_Var27 = *(attr_list *)(lVar38 + 0x40);
          p_Var4->in_get_conn = 1;
          p_Var26 = INT_CMget_conn(cm,p_Var27);
          p_Var4->in_get_conn = p_Var4->in_get_conn + -1;
          if (*(long *)(lVar38 + 0x18) == 0) {
            *(CMConnection *)(lVar38 + 0x18) = p_Var26;
          }
          else {
            INT_CMConnection_dereference(p_Var26);
            p_Var26 = *(CMConnection *)(lVar38 + 0x18);
          }
          if (p_Var26 == (CMConnection)0x0) {
            pFVar30 = (FILE *)cm->CMTrace_file;
            if (pFVar30 == (FILE *)0x0) {
              iVar29 = CMtrace_init(cm,EVWarning);
              if (iVar29 == 0) goto LAB_0013321d;
              pFVar30 = (FILE *)cm->CMTrace_file;
            }
            else if (CMtrace_val[0xb] == 0) goto LAB_0013321d;
            fwrite("EVassoc_bridge_action - failed to contact host at contact point \n\t",0x42,1,
                   pFVar30);
            if (p_Var27 == (attr_list)0x0) {
              fwrite("NULL\n",5,1,(FILE *)cm->CMTrace_file);
            }
            else {
              fdump_attr_list((FILE *)cm->CMTrace_file,p_Var27);
            }
            fprintf((FILE *)cm->CMTrace_file,
                    "Bridge action association failed for stone %x, outputting to remote stone %x\n"
                    ,(ulong)(uint)s,(ulong)*(uint *)(lVar38 + 0x20));
            *(undefined4 *)(lVar38 + 0x30) = 1;
            goto LAB_0013321d;
          }
          INT_CMconn_register_close_handler(p_Var26,stone_close_handler,(void *)(long)s);
        }
        remote_path_id = (uint *)(lVar38 + 0x20);
LAB_001333b3:
        do {
          if (p_Var17->queue->queue_head == (queue_item *)0x0) goto LAB_001339e3;
          if (((*(CMConnection *)(lVar38 + 0x18) != (CMConnection)0x0) &&
              (iVar29 = INT_CMConnection_write_would_block(*(CMConnection *)(lVar38 + 0x18)),
              iVar29 != 0)) &&
             (INT_CMConnection_wait_for_pending_write(*(CMConnection *)(lVar38 + 0x18)),
             p_Var17->queue->queue_head == (queue_item *)0x0)) break;
          peVar18 = dequeue_event(cm,p_Var17);
          event_length = 0;
          if (*(long *)(lVar38 + 0x18) == 0) {
            iVar29 = CMtrace_val[10];
            if (cm->CMTrace_file == (FILE *)0x0) {
              iVar29 = CMtrace_init(cm,EVerbose);
            }
            if (iVar29 != 0) {
              if (CMtrace_PID != 0) {
                pFVar30 = (FILE *)cm->CMTrace_file;
                _Var16 = getpid();
                pVar28 = pthread_self();
                fprintf(pFVar30,"P%lxT%lx - ",(long)_Var16,pVar28);
              }
              if (CMtrace_timing != 0) {
                clock_gettime(1,(timespec *)&ts);
                fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
              }
              fprintf((FILE *)cm->CMTrace_file,"Bridge stone %x has closed connection\n",
                      (ulong)(uint)s);
            }
            p_Var26 = (CMConnection)cm->CMTrace_file;
            fflush((FILE *)p_Var26);
LAB_001336c4:
            return_event((event_path_data)p_Var26,peVar18);
            backpressure_check(cm,s);
          }
          else {
            iVar29 = CMtrace_val[10];
            if (cm->CMTrace_file == (FILE *)0x0) {
              iVar29 = CMtrace_init(cm,EVerbose);
            }
            if (iVar29 != 0) {
              if (CMtrace_PID != 0) {
                pFVar30 = (FILE *)cm->CMTrace_file;
                _Var16 = getpid();
                pVar28 = pthread_self();
                fprintf(pFVar30,"P%lxT%lx - ",(long)_Var16,pVar28);
              }
              if (CMtrace_timing != 0) {
                clock_gettime(1,(timespec *)&ts);
                fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
              }
              fprintf((FILE *)cm->CMTrace_file,"Writing event to remote stone %x\n",
                      (ulong)*remote_path_id);
            }
            fflush((FILE *)cm->CMTrace_file);
            if (peVar18->format != (CMFormat)0x0) {
              p_Var26 = *(CMConnection *)(lVar38 + 0x18);
              iVar29 = internal_write_event
                                 (p_Var26,peVar18->format,remote_path_id,4,peVar18,peVar18->attrs,
                                  &event_length);
              if (iVar29 != 0) goto LAB_001336c4;
              pcVar36 = "DETECTED FAILED EVENT WRITE";
              puts("DETECTED FAILED EVENT WRITE");
              return_event((event_path_data)pcVar36,peVar18);
              backpressure_check(cm,s);
LAB_001335df:
              pFVar30 = (FILE *)cm->CMTrace_file;
              if (pFVar30 == (FILE *)0x0) {
                iVar29 = CMtrace_init(cm,EVWarning);
                if (iVar29 != 0) {
                  pFVar30 = (FILE *)cm->CMTrace_file;
                  goto LAB_001337c7;
                }
              }
              else if (CMtrace_val[0xb] != 0) {
LAB_001337c7:
                fprintf(pFVar30,
                        "Warning!  Write failed for output action %d on stone %x, event likely not transmitted\n"
                        ,(ulong)uVar14,(ulong)(uint)s);
                fwrite("   -  Bridge stone ",0x13,1,(FILE *)cm->CMTrace_file);
                fprint_stone_identifier(cm->CMTrace_file,p_Var4,s);
                fwrite(" disabled\n",10,1,(FILE *)cm->CMTrace_file);
              }
              if (*(long *)(lVar38 + 0x18) != 0) {
                iVar29 = CMtrace_val[7];
                if (cm->CMTrace_file == (FILE *)0x0) {
                  iVar29 = CMtrace_init(cm,CMFreeVerbose);
                }
                if (iVar29 != 0) {
                  if (CMtrace_PID != 0) {
                    pFVar30 = (FILE *)cm->CMTrace_file;
                    _Var16 = getpid();
                    pVar28 = pthread_self();
                    fprintf(pFVar30,"P%lxT%lx - ",(long)_Var16,pVar28);
                  }
                  if (CMtrace_timing != 0) {
                    clock_gettime(1,(timespec *)&ts);
                    fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
                  }
                  fprintf((FILE *)cm->CMTrace_file,
                          "Closing and dereferencing conn after write failure %p\n",
                          *(undefined8 *)(lVar38 + 0x18));
                }
                fflush((FILE *)cm->CMTrace_file);
                INT_CMConnection_failed(*(CMConnection *)(lVar38 + 0x18));
                INT_CMConnection_close(*(CMConnection *)(lVar38 + 0x18));
              }
              *(undefined4 *)(lVar38 + 0x30) = 1;
              *(undefined8 *)(lVar38 + 0x18) = 0;
              goto LAB_001333b3;
            }
            if (peVar18->reference_format == (FMFormat)0x0) {
              iVar29 = CMtrace_val[0xb];
              if (cm->CMTrace_file == (FILE *)0x0) {
                iVar29 = CMtrace_init(cm,EVWarning);
              }
              if (iVar29 != 0) {
                if (CMtrace_PID != 0) {
                  pFVar30 = (FILE *)cm->CMTrace_file;
                  _Var16 = getpid();
                  pVar28 = pthread_self();
                  fprintf(pFVar30,"P%lxT%lx - ",(long)_Var16,pVar28);
                }
                if (CMtrace_timing != 0) {
                  clock_gettime(1,(timespec *)&ts_2);
                  fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",
                          CONCAT44(ts_2.tv_sec._4_4_,(int)ts_2.tv_sec),ts_2.tv_nsec);
                }
                fwrite("Tried to output event with NULL reference format.  Event discarded.\n",0x44,
                       1,(FILE *)cm->CMTrace_file);
              }
              p_Var26 = (CMConnection)cm->CMTrace_file;
              fflush((FILE *)p_Var26);
              goto LAB_001336c4;
            }
            ts.tv_nsec = name_of_FMformat();
            p_Var26 = *(CMConnection *)(lVar38 + 0x18);
            iVar29 = internal_write_event
                               (p_Var26,(CMFormat)&ts,remote_path_id,4,peVar18,peVar18->attrs,
                                &event_length);
            return_event((event_path_data)p_Var26,peVar18);
            backpressure_check(cm,s);
            if (iVar29 == 0) goto LAB_001335df;
          }
          ts.tv_sec = 0;
          ts_2.tv_sec._0_4_ = 0;
          if (do_bridge_action_EV_EVENT_COUNT == -1) {
            do_bridge_action_EV_EVENT_COUNT = attr_atom_from_string("EV_EVENT_COUNT");
            do_bridge_action_EV_EVENT_LSUM = attr_atom_from_string("EV_EVENT_LSUM");
          }
          if (p_Var17->stone_attrs == (attr_list)0x0) {
            p_Var27 = (attr_list)create_attr_list();
            p_Var17->stone_attrs = p_Var27;
          }
          else {
            get_int_attr(p_Var17->stone_attrs,do_bridge_action_EV_EVENT_COUNT,&ts_2);
            get_long_attr(p_Var17->stone_attrs,do_bridge_action_EV_EVENT_LSUM,&ts);
            p_Var27 = p_Var17->stone_attrs;
          }
          ts_2.tv_sec._0_4_ = (int)ts_2.tv_sec + 1;
          ts.tv_sec = ts.tv_sec + event_length;
          set_int_attr(p_Var27,do_bridge_action_EV_EVENT_COUNT);
          set_long_attr(p_Var17->stone_attrs,do_bridge_action_EV_EVENT_LSUM,ts.tv_sec);
        } while( true );
      }
    }
    else if (p_Var4->delay_task_pending == 0) {
      p_Var4->delay_task_pending = 1;
      INT_CMadd_delayed_task(cm,0,100,deferred_process_actions,(void *)0x0);
    }
  }
LAB_0013321d:
  stone->is_processing = 0;
  return 0;
LAB_00132c15:
  if ((0x840U >> (aVar2 & 0x1f) & 1) != 0) {
    if ((stone->new_enqueue_flag == 0) || (pqVar24->handled != 0)) {
LAB_00133240:
      if (!bVar13) {
        return iVar29;
      }
    }
    else {
      stone->is_processing = 1;
      pqVar24->handled = 1;
      iVar31 = (*prVar21[(int)uVar14].o.imm.handler)
                         (cm,(_event_item *)stone->queue,pqVar24,
                          (attr_list)prVar21[(int)uVar14].o.decode.target_reference_format,
                          stone->output_count,stone->output_stone_ids);
      iVar29 = (iVar29 + 1) - (uint)(iVar31 == 0);
      stone = stone_struct(cm->evp,s);
      stone->is_processing = 0;
    }
    stone->new_enqueue_flag = 0;
    return iVar29;
  }
  goto LAB_00132332;
LAB_001339e3:
  p_Var17->is_outputting = 0;
  goto LAB_0013321d;
}

Assistant:

static int
process_events_stone(CManager cm, int s, action_class c)
{

/*  Process all possible events on this stone that match the class */

    event_path_data evp = cm->evp;
    stone_type stone = NULL;
    int more_pending = 0;
    int did_something = 0;
    queue_item *item;
    action_state as = evp->as;


    if (s == -1) return 0;
    if (as->last_active_stone == s) as->last_active_stone = -1;
    stone = stone_struct(cm->evp, s);
    if (!stone) return 0;
    if (stone->queue_size == 0) return 0;
    if (CMtrace_on(cm, EVerbose)) {
	fprintf(cm->CMTrace_file, "Considering events on ");
	fprint_stone_identifier(cm->CMTrace_file, evp, s);
	fprintf(cm->CMTrace_file, "\n");
    }
    if (stone->local_id == -1) return 0;
    if (stone->is_draining == 2) return 0;
    if (stone->is_frozen == 1) return 0;
    if (c == Immediate_and_Multi && stone->pending_output) {
        more_pending += process_stone_pending_output(cm, s);
    }
    if (is_bridge_stone(cm, s) && (c != Bridge) && (c != Congestion)) return 0;
    
    if (CMtrace_on(cm, EVerbose)) {
	fprintf(cm->CMTrace_file, "Process events ");
	fprint_stone_identifier(cm->CMTrace_file, evp, s);
	fprintf(cm->CMTrace_file, "\n");
    }
    item = stone->queue->queue_head;
    if (is_bridge_stone(cm, s) && (c == Bridge)) {
	stone->is_processing = 1;
	do_bridge_action(cm, s);
	stone->is_processing = 0;
	return 0;
    }
    while (item != NULL && stone->is_draining == 0 && stone->is_frozen == 0) {
	queue_item *next = item->next;
	response_cache_element *resp;
	response_cache_element *act = NULL;
	if (item->handled) {
	    item = next;
	    continue;
	} else {
	    /* determine what kind of action to take here */
	    int resp_id;
	    event_item *event = item->item;
	    resp_id = determine_action(cm, stone, c, item->item, 0);
            assert(resp_id < stone->response_cache_count);
	    if (stone->response_cache[resp_id].action_type == Action_NoAction
                && c == Immediate_and_Multi) {
                /* ignore event */
                char *tmp = NULL;
                if (event->reference_format)
                    tmp = global_name_of_FMFormat(event->reference_format);
                printf("No action found for event %p submitted to \n", event);
		print_stone_identifier(evp, s);
		printf("\n");
                dump_stone(stone_struct(evp, s));
                if (tmp != NULL) {
                    static int first = 1;
                    printf("    Unhandled incoming event format was \"%s\"\n", tmp);
                    if (first) {
                        first = 0;
                        printf("\n\t** use \"format_info <format_name>\" to get full format information ** \n\n");
                    }
                } else {
                    printf("    Unhandled incoming event format was NULL\n");
                }
                if (tmp) free(tmp);
                event = dequeue_item(cm, stone, item);
                return_event(evp, event);
            }
	    resp = &stone->response_cache[resp_id];
	    if (resp->action_type == Action_Decode) {
		event_item *event_to_submit;
		if (!event->event_encoded) {
		    event_item *old_data_event;
		    CMtrace_out(cm, EVerbose, "Encoding event prior to decode for conversion, action id %d\n", resp_id);
		    old_data_event = reassign_memory_event(cm, event, 0);  /* reassign memory */
		    return_event(evp, old_data_event);
		    event->ref_count++;
		}
		CMtrace_out(cm, EVerbose, "Decoding event, action id %d\n", resp_id);
		event_to_submit = decode_action(cm, event, resp);
		if (event_to_submit == NULL) return more_pending;
		item->item = event_to_submit;
		resp_id = determine_action(cm, stone, c, event_to_submit, 0);
		resp = &stone->response_cache[resp_id];
	    }
	    if (CMtrace_on(cm, EVerbose)) {
		fprintf(cm->CMTrace_file, "next action event %p on ", event);
		fprint_stone_identifier(cm->CMTrace_file, evp, s);
		fprintf(cm->CMTrace_file, " action type is %s, reference_format is %p (%s), stage is %d, requires_decoded is %d\n",
			action_str[resp->action_type], resp->reference_format, 
			resp->reference_format ? global_name_of_FMFormat(resp->reference_format) : "<none>",
			resp->stage, resp->requires_decoded);
		fdump_action(cm->CMTrace_file, stone, resp, resp->proto_action_id, "    ");
	    }
            act = &stone->response_cache[resp_id];
	}
        backpressure_check(cm, s);
        if (!compatible_stages(c, act->stage)) {
	    /* do nothing */
        } else if (is_immediate_action(act)) {
	    event_item *event = dequeue_item(cm, stone, item);
	    ev_handler_activation_rec act_rec;
	    switch(act->action_type) {
	    case Action_Terminal:
	    case Action_Filter: {
		/* the data should already be in the right format */
		int proto = act->proto_action_id;
		proto_action *p = &stone->proto_actions[proto];
		int out;
		struct terminal_proto_vals *term = &(p->o.term);
		EVSimpleHandlerFunc handler = term->handler;
		void *client_data = term->client_data;
		CMtrace_out(cm, EVerbose, "Executing terminal/filter event\n");
		update_event_length_sum(cm, p, event);
		{
		    queue_item *new = malloc(sizeof(queue_item));
		    new->item = event;
		    new->next = cm->evp->current_event_list;
		    cm->evp->current_event_list = new;
		}
		did_something=1;
		stone->is_processing = 1;
		if ((p->data_state == Requires_Contig_Encoded) && 
		    (event->event_encoded == 0)) {
		    encode_event(cm, event);
		}
		act_rec.stone_id = stone->local_id;
		push_activation_record_on_stack(cm, &act_rec);
		CManager_unlock(cm);
		if (event->event_encoded == 0) {
		    out = (handler)(cm, event->decoded_event, client_data,
				    event->attrs);
		} else {
		    EVRawHandlerFunc han = (EVRawHandlerFunc)term->handler;
		    out = (han)(cm, event->encoded_event, event->event_len,
				    client_data, event->attrs);
		}
		CManager_lock(cm);
		stone = stone_struct(cm->evp, s);
		pop_activation_record_from_stack(cm, &act_rec);
		stone->is_processing = 0;
		{
		    if (cm->evp->current_event_list->item == event) {
			queue_item *tmp = cm->evp->current_event_list;
			cm->evp->current_event_list = tmp->next;
			free(tmp);
		    } else {
			queue_item *tmp = cm->evp->current_event_list;
			queue_item *last;
			while(tmp->item != event) {
			    last = tmp;
			    tmp = tmp->next;
			    if (tmp == NULL) break;
			}
			if (tmp == NULL) {
			    printf("Failed to dequeue item from executing events list!\n");
			} else {
			    last->next = tmp->next;
			    free(tmp);
			}
		    }
		}

		if (act->action_type == Action_Filter) {
		    if (out) {
			CMtrace_out(cm, EVerbose, "Filter passed event to stone %x, submitting\n", term->target_stone_id);
			internal_path_submit(cm, 
					     term->target_stone_id,
					     event);
			more_pending++;
		    } else {
			CMtrace_out(cm, EVerbose, "Filter discarded event\n");
		    }			    
		} else {
		    CMtrace_out(cm, EVerbose, "Finish terminal event\n");
		}
		return_event(evp, event);
		break;
	    }
	    case Action_Split: {
		int t = 0;
		proto_action *p = &stone->proto_actions[act->proto_action_id];
		update_event_length_sum(cm, p, event);
		for (t=0; t < stone->output_count; t++) {
		    if (stone->output_stone_ids[t] != -1) {
			internal_path_submit(cm, 
					     stone->output_stone_ids[t],
					     event);
			more_pending++;
		    }
		}
		return_event(evp, event);
		break;
	    }
	    case Action_Immediate: {
		EVImmediateHandlerFunc func;
		void *client_data;
		int *out_stones;
		int out_count;
		int in_play = as->events_in_play;
		/* data is already in the right format */
		func = act->o.imm.handler;
		client_data = act->o.imm.client_data;
		out_stones = stone->output_stone_ids;
		out_count = stone->output_count;
		did_something = 1;
		stone->is_processing = 1;
		func(cm, event, client_data, event->attrs, out_count, out_stones);
		stone = stone_struct(cm->evp, s);
		stone->is_processing = 0;
		return_event(evp, event);
		if (as->events_in_play > in_play)
		    more_pending++;   /* maybe??? */
		break;
	    }
            case Action_Store: {
		proto_action *p = &stone->proto_actions[act->proto_action_id];
                storage_queue_enqueue(cm, &p->o.store.queue, event);
                CMtrace_out(cm, EVerbose, "Enqueued item to store\n");
                if (++p->o.store.num_stored > p->o.store.max_stored
                        && p->o.store.max_stored != -1) {
                    CMtrace_out(cm, EVerbose, "Dequeuing item because of limit\n");
                    event_item *last_event;
                    last_event = storage_queue_dequeue(cm, &p->o.store.queue);
                    assert(last_event->ref_count > 0);
                    --p->o.store.num_stored;
                    internal_path_submit(cm, p->o.store.target_stone_id, last_event);
                    return_event(evp, last_event);
                    more_pending++;
                }
                break;
            }
	    case Action_Thread_Bridge: {
		proto_action *p = &stone->proto_actions[act->proto_action_id];
		if (p->o.thr_bri.target_cm_shutdown) continue;
                thread_bridge_transfer(cm, event, p->o.thr_bri.target_cm,
				       p->o.thr_bri.target_stone_id);
		break;
	    }
	    case Action_Bridge:
	    default:
		assert(FALSE);
	    }
	} else if (is_multi_action(act) || is_congestion_action(act)) {
	    /* event_item *event = dequeue_item(cm, stone->queue, item); XXX */
	    if (stone->new_enqueue_flag) {
		if (!item->handled) {
		    did_something = 1;
		    stone->is_processing = 1;
		    item->handled = 1;
		    if ((act->o.multi.handler)(cm, stone->queue, item,
					       act->o.multi.client_data, stone->output_count,
					       stone->output_stone_ids))
			more_pending++;
		    stone = stone_struct(cm->evp, s);
		    stone->is_processing = 0;
		}
	    }
            break;    
	} 
	item = next;
    }
    if (did_something) {
	stone->new_enqueue_flag = 0;
    }
    return more_pending;
}